

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3SubqueryColumnTypes(Parse *pParse,Table *pTab,Select *pSelect,char aff)

{
  sqlite3 *db;
  ExprList *pEVar1;
  Expr *pExpr;
  long lVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  CollSeq *pCVar8;
  long lVar9;
  Select *pSVar10;
  uint uVar11;
  Column *pCol;
  Select *pSVar12;
  Select *pSVar13;
  long lVar14;
  long in_FS_OFFSET;
  NameContext local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = pParse->db;
  if ((db->mallocFailed == '\0') && (pParse->eParseMode < 2)) {
    do {
      pSVar10 = pSelect;
      pSelect = pSVar10->pPrior;
    } while (pSVar10->pPrior != (Select *)0x0);
    pEVar1 = pSVar10->pEList;
    local_78.nRef = 0;
    local_78.nNcErr = 0;
    local_78.ncFlags = 0;
    local_78.nNestedSelect = 0;
    local_78.uNC.pEList = (ExprList *)0x0;
    local_78.pNext = (NameContext *)0x0;
    local_78.pWinSelect = (Select *)0x0;
    local_78.pParse = (Parse *)0x0;
    local_78.pSrcList = pSVar10->pSrc;
    pCol = pTab->aCol;
    for (lVar9 = 0; lVar9 < pTab->nCol; lVar9 = lVar9 + 1) {
      pTab->tabFlags = pTab->tabFlags | pCol->colFlags & 0x62;
      pExpr = pEVar1->a[lVar9].pExpr;
      cVar3 = sqlite3ExprAffinity(pExpr);
      uVar11 = 0;
      pSVar13 = pSVar10;
      while (pCol->affinity = cVar3, cVar3 < 'A') {
        if (pSVar13->pNext == (Select *)0x0) {
          pCol->affinity = aff;
          cVar3 = aff;
          break;
        }
        uVar5 = sqlite3ExprDataType(pSVar13->pEList->a[lVar9].pExpr);
        uVar11 = uVar11 | uVar5;
        pSVar13 = pSVar13->pNext;
        cVar3 = sqlite3ExprAffinity(pSVar13->pEList->a[lVar9].pExpr);
      }
      if (('A' < cVar3) &&
         (pSVar12 = pSVar13->pNext, pSVar13 != pSVar10 || pSVar12 != (Select *)0x0)) {
        for (; pSVar12 != (Select *)0x0; pSVar12 = pSVar12->pNext) {
          uVar5 = sqlite3ExprDataType(pSVar12->pEList->a[lVar9].pExpr);
          uVar11 = uVar11 | uVar5;
        }
        cVar3 = pCol->affinity;
        cVar4 = 'A';
        if ((((cVar3 == 'B') && ((uVar11 & 1) != 0)) || (('B' < cVar3 && ((uVar11 & 2) != 0)))) ||
           (('B' < cVar3 && (cVar4 = 'F', pExpr->op == '$')))) {
          pCol->affinity = cVar4;
        }
      }
      pcVar6 = columnTypeImpl(&local_78,pExpr,(char **)0x0,(char **)0x0,(char **)0x0);
      if ((pcVar6 == (char *)0x0) ||
         (cVar3 = pCol->affinity, cVar4 = sqlite3AffinityType(pcVar6,(Column *)0x0), cVar3 != cVar4)
         ) {
        cVar3 = pCol->affinity;
        pcVar6 = "NUM";
        if ((cVar3 == 'C') || (pcVar6 = "NUM", cVar3 == 'F')) goto LAB_0017d60b;
        pcVar6 = "CADDEB";
        lVar2 = 0;
        do {
          lVar14 = lVar2;
          pcVar6 = pcVar6 + 1;
          if (lVar14 == 0x28) goto LAB_0017d662;
          lVar2 = lVar14 + 8;
        } while (*pcVar6 != cVar3);
        pcVar6 = *(char **)((long)sqlite3StdType + lVar14 + 8);
        if (pcVar6 != (char *)0x0) goto LAB_0017d60b;
      }
      else {
LAB_0017d60b:
        uVar11 = sqlite3Strlen30(pcVar6);
        pcVar7 = pCol->zCnName;
        uVar5 = sqlite3Strlen30(pcVar7);
        pcVar7 = (char *)sqlite3DbReallocOrFree(db,pcVar7,(ulong)uVar11 + (ulong)uVar5 + 2);
        pCol->zCnName = pcVar7;
        pCol->colFlags = pCol->colFlags & 0xfdfb;
        if (pcVar7 != (char *)0x0) {
          memcpy(pcVar7 + (ulong)uVar5 + 1,pcVar6,(ulong)uVar11 + 1);
          *(byte *)&pCol->colFlags = (byte)pCol->colFlags | 4;
        }
      }
LAB_0017d662:
      pCVar8 = sqlite3ExprCollSeq(pParse,pExpr);
      if (pCVar8 != (CollSeq *)0x0) {
        sqlite3ColumnSetColl(db,pCol,pCVar8->zName);
      }
      pCol = pCol + 1;
    }
    pTab->szTabRow = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SubqueryColumnTypes(
  Parse *pParse,      /* Parsing contexts */
  Table *pTab,        /* Add column type information to this table */
  Select *pSelect,    /* SELECT used to determine types and collations */
  char aff            /* Default affinity. */
){
  sqlite3 *db = pParse->db;
  Column *pCol;
  CollSeq *pColl;
  int i,j;
  Expr *p;
  struct ExprList_item *a;
  NameContext sNC;

  assert( pSelect!=0 );
  assert( (pSelect->selFlags & SF_Resolved)!=0 );
  assert( pTab->nCol==pSelect->pEList->nExpr || pParse->nErr>0 );
  assert( aff==SQLITE_AFF_NONE || aff==SQLITE_AFF_BLOB );
  if( db->mallocFailed || IN_RENAME_OBJECT ) return;
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  a = pSelect->pEList->a;
  memset(&sNC, 0, sizeof(sNC));
  sNC.pSrcList = pSelect->pSrc;
  for(i=0, pCol=pTab->aCol; i<pTab->nCol; i++, pCol++){
    const char *zType;
    i64 n;
    int m = 0;
    Select *pS2 = pSelect;
    pTab->tabFlags |= (pCol->colFlags & COLFLAG_NOINSERT);
    p = a[i].pExpr;
    /* pCol->szEst = ... // Column size est for SELECT tables never used */
    pCol->affinity = sqlite3ExprAffinity(p);
    while( pCol->affinity<=SQLITE_AFF_NONE && pS2->pNext!=0 ){
      m |= sqlite3ExprDataType(pS2->pEList->a[i].pExpr);
      pS2 = pS2->pNext;
      pCol->affinity = sqlite3ExprAffinity(pS2->pEList->a[i].pExpr);
    }
    if( pCol->affinity<=SQLITE_AFF_NONE ){
      pCol->affinity = aff;
    }
    if( pCol->affinity>=SQLITE_AFF_TEXT && (pS2->pNext || pS2!=pSelect) ){
      for(pS2=pS2->pNext; pS2; pS2=pS2->pNext){
        m |= sqlite3ExprDataType(pS2->pEList->a[i].pExpr);
      }
      if( pCol->affinity==SQLITE_AFF_TEXT && (m&0x01)!=0 ){
        pCol->affinity = SQLITE_AFF_BLOB;
      }else
      if( pCol->affinity>=SQLITE_AFF_NUMERIC && (m&0x02)!=0 ){
        pCol->affinity = SQLITE_AFF_BLOB;
      }
      if( pCol->affinity>=SQLITE_AFF_NUMERIC && p->op==TK_CAST ){
        pCol->affinity = SQLITE_AFF_FLEXNUM;
      }
    }
    zType = columnType(&sNC, p, 0, 0, 0);
    if( zType==0 || pCol->affinity!=sqlite3AffinityType(zType, 0) ){
      if( pCol->affinity==SQLITE_AFF_NUMERIC
       || pCol->affinity==SQLITE_AFF_FLEXNUM
      ){
        zType = "NUM";
      }else{
        zType = 0;
        for(j=1; j<SQLITE_N_STDTYPE; j++){
          if( sqlite3StdTypeAffinity[j]==pCol->affinity ){
            zType = sqlite3StdType[j];
            break;
          }
        }
      }
    }
    if( zType ){
      const i64 k = sqlite3Strlen30(zType);
      n = sqlite3Strlen30(pCol->zCnName);
      pCol->zCnName = sqlite3DbReallocOrFree(db, pCol->zCnName, n+k+2);
      pCol->colFlags &= ~(COLFLAG_HASTYPE|COLFLAG_HASCOLL);
      if( pCol->zCnName ){
        memcpy(&pCol->zCnName[n+1], zType, k+1);
        pCol->colFlags |= COLFLAG_HASTYPE;
      }
    }
    pColl = sqlite3ExprCollSeq(pParse, p);
    if( pColl ){
      assert( pTab->pIndex==0 );
      sqlite3ColumnSetColl(db, pCol, pColl->zName);
    }
  }
  pTab->szTabRow = 1; /* Any non-zero value works */
}